

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateFrameworkMethods
          (MessageGenerator *this,Printer *printer)

{
  mapped_type *this_00;
  FieldGeneratorBase *pFVar1;
  Descriptor *pDVar2;
  long lVar3;
  long lVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_a0;
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  lVar3 = **(long **)this->descriptor_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,lVar3,(*(long **)this->descriptor_)[1] + lVar3);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"class_name","");
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_60,&local_80);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60,
                     "public override bool Equals(object other) {\n  return Equals(other as $class_name$);\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60,
                     "public bool Equals($class_name$ other) {\n  if (ReferenceEquals(other, null)) {\n    return false;\n  }\n  if (ReferenceEquals(other, this)) {\n    return true;\n  }\n"
                    );
  io::Printer::Indent(printer);
  pDVar2 = this->descriptor_;
  if (0 < *(int *)(pDVar2 + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pFVar1 = CreateFieldGeneratorInternal
                         (this,(FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar3));
      if (pFVar1 == (FieldGeneratorBase *)0x0) goto LAB_002682fa;
      (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xb])(pFVar1,printer);
      (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar1);
      lVar4 = lVar4 + 1;
      pDVar2 = this->descriptor_;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(pDVar2 + 0x2c));
  }
  if (0 < *(int *)(pDVar2 + 0x38)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      UnderscoresToCamelCase(&local_a0,*(string **)(*(long *)(pDVar2 + 0x40) + lVar3),true,false);
      io::Printer::Print(printer,
                         "if ($property_name$Case != other.$property_name$Case) return false;\n",
                         "property_name",&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      lVar4 = lVar4 + 1;
      pDVar2 = this->descriptor_;
      lVar3 = lVar3 + 0x30;
    } while (lVar4 < *(int *)(pDVar2 + 0x38));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return true;\n}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,"public override int GetHashCode() {\n  int hash = 1;\n");
  io::Printer::Indent(printer);
  pDVar2 = this->descriptor_;
  if (0 < *(int *)(pDVar2 + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pFVar1 = CreateFieldGeneratorInternal
                         (this,(FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar3));
      if (pFVar1 == (FieldGeneratorBase *)0x0) {
LAB_002682fa:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::operator->() const [C = google::protobuf::compiler::csharp::FieldGeneratorBase]"
                     );
      }
      (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[10])(pFVar1,printer);
      (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar1);
      lVar4 = lVar4 + 1;
      pDVar2 = this->descriptor_;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(pDVar2 + 0x2c));
  }
  if (0 < *(int *)(pDVar2 + 0x38)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      UnderscoresToCamelCase(&local_a0,*(string **)(*(long *)(pDVar2 + 0x40) + lVar3),false,false);
      io::Printer::Print(printer,"hash ^= (int) $name$Case_;\n","name",&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      lVar4 = lVar4 + 1;
      pDVar2 = this->descriptor_;
      lVar3 = lVar3 + 0x30;
    } while (lVar4 < *(int *)(pDVar2 + 0x38));
  }
  io::Printer::Print(printer,"return hash;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,
                     "public override string ToString() {\n  return pb::JsonFormatter.ToDiagnosticString(this);\n}\n\n"
                    );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MessageGenerator::GenerateFrameworkMethods(io::Printer* printer) {
    map<string, string> vars;
    vars["class_name"] = class_name();

    // Equality
	WriteGeneratedCodeAttributes(printer);
    printer->Print(
        vars,
        "public override bool Equals(object other) {\n"
        "  return Equals(other as $class_name$);\n"
        "}\n\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	    vars,
        "public bool Equals($class_name$ other) {\n"
        "  if (ReferenceEquals(other, null)) {\n"
        "    return false;\n"
        "  }\n"
        "  if (ReferenceEquals(other, this)) {\n"
        "    return true;\n"
        "  }\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
        scoped_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteEquals(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
        printer->Print("if ($property_name$Case != other.$property_name$Case) return false;\n",
            "property_name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true));
    }
    printer->Outdent();
    printer->Print(
        "  return true;\n"
        "}\n\n");

    // GetHashCode
    // Start with a non-zero value to easily distinguish between null and "empty" messages.
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
        "public override int GetHashCode() {\n"
        "  int hash = 1;\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
        scoped_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteHash(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
        printer->Print("hash ^= (int) $name$Case_;\n",
            "name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false));
    }
    printer->Print("return hash;\n");
    printer->Outdent();
    printer->Print("}\n\n");

	WriteGeneratedCodeAttributes(printer);
	printer->Print(
        "public override string ToString() {\n"
        "  return pb::JsonFormatter.ToDiagnosticString(this);\n"
        "}\n\n");
}